

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)

{
  short sVar1;
  uint16_t y0;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  uint16_t x0;
  uint16_t x0_00;
  int iVar6;
  int iVar7;
  uint16_t y0_00;
  
  uVar5 = CONCAT62(in_register_00000012,Radius);
  iVar6 = (int)uVar5 * -2 + 3;
  uVar2 = 0;
  iVar7 = 6;
  x0 = Xpos;
  y0 = Ypos;
  y0_00 = Ypos;
  while( true ) {
    uVar4 = (uint)uVar5;
    if (uVar4 <= uVar2 && uVar2 - uVar4 != 0) break;
    x0_00 = Xpos + (short)uVar2;
    sVar1 = (short)uVar5;
    EPD_DrawPixel(x0_00,Ypos - sVar1,color);
    EPD_DrawPixel(x0,Ypos - sVar1,color);
    EPD_DrawPixel(sVar1 + Xpos,y0,color);
    EPD_DrawPixel(Xpos - sVar1,y0,color);
    EPD_DrawPixel(x0_00,sVar1 + Ypos,color);
    EPD_DrawPixel(x0,sVar1 + Ypos,color);
    EPD_DrawPixel(sVar1 + Xpos,y0_00,color);
    EPD_DrawPixel(Xpos - sVar1,y0_00,color);
    iVar3 = iVar7;
    if (-1 < iVar6) {
      uVar5 = (ulong)(uVar4 - 1);
      iVar3 = (uVar2 - uVar4) * 4 + 10;
    }
    iVar6 = iVar6 + iVar3;
    uVar2 = uVar2 + 1;
    iVar7 = iVar7 + 4;
    y0_00 = y0_00 + 1;
    y0 = y0 - 1;
    x0 = x0 - 1;
  }
  return;
}

Assistant:

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)
{
	  int   decision;    	/* Decision Variable */ 
	  uint32_t  current_x;   	/* Current X Value */
	  uint32_t  current_y;   	/* Current Y Value */
	  
	  decision = 3 - (Radius << 1);
	  current_x = 0;
	  current_y = Radius;
	  
	  while (current_x <= current_y)
	  {
		    EPD_DrawPixel((Xpos + current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos + current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos + current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos + current_x), color);
		    
		    if (decision < 0)
		    { 
				decision += (current_x << 2) + 6;
		    }
		    else
		    {
			      decision += ((current_x - current_y) << 2) + 10;
			      current_y--;
		    }
		    current_x++;
	  } 
}